

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtExternalObject.cpp
# Opt level: O0

void __thiscall JsrtExternalObject::Finalize(JsrtExternalObject *this,bool isShutdown)

{
  code *pcVar1;
  JsrtContext *pJVar2;
  bool bVar3;
  JsrtExternalType *pJVar4;
  JsTraceCallback p_Var5;
  undefined4 *puVar6;
  void *pvVar7;
  undefined1 local_30 [8];
  JsrtCallbackState scope;
  JsFinalizeCallback finalizeCallback;
  bool isShutdown_local;
  JsrtExternalObject *this_local;
  
  pJVar4 = GetExternalType(this);
  scope.originalJsrtContext = (JsrtContext *)JsrtExternalType::GetJsFinalizeCallback(pJVar4);
  pJVar4 = GetExternalType(this);
  p_Var5 = JsrtExternalType::GetJsTraceCallback(pJVar4);
  if ((p_Var5 == (JsTraceCallback)0x0) && (scope.originalJsrtContext == (JsrtContext *)0x0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/JsrtExternalObject.cpp"
                       ,0xc6,
                       "(this->GetExternalType()->GetJsTraceCallback() != nullptr || finalizeCallback != nullptr)"
                       ,
                       "this->GetExternalType()->GetJsTraceCallback() != nullptr || finalizeCallback != nullptr"
                      );
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  if (scope.originalJsrtContext != (JsrtContext *)0x0) {
    JsrtCallbackState::JsrtCallbackState((JsrtCallbackState *)local_30,(ThreadContext *)0x0);
    pJVar2 = scope.originalJsrtContext;
    pvVar7 = GetSlotData(this);
    (*(code *)pJVar2)(pvVar7);
    JsrtCallbackState::~JsrtCallbackState((JsrtCallbackState *)local_30);
  }
  return;
}

Assistant:

void JsrtExternalObject::Finalize(bool isShutdown)
{
    JsFinalizeCallback finalizeCallback = this->GetExternalType()->GetJsFinalizeCallback();
#ifdef _CHAKRACOREBUILD
    Assert(this->GetExternalType()->GetJsTraceCallback() != nullptr || finalizeCallback != nullptr);
#else
    Assert(finalizeCallback != nullptr);
#endif
    if (nullptr != finalizeCallback)
    {
        JsrtCallbackState scope(nullptr);
        finalizeCallback(this->GetSlotData());
    }
}